

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<8>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<8>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  Vec3fx VVar4;
  undefined4 uVar5;
  CachedAllocator alloc_00;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ulong uVar7;
  size_t i_1;
  long lVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar9;
  size_t sVar10;
  undefined8 *puVar11;
  ulong uVar12;
  range<unsigned_int> *current_00;
  ulong uVar13;
  ulong uVar14;
  range<unsigned_int> rVar15;
  uint uVar16;
  ulong uVar17;
  range<unsigned_int> rVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  Vec3fx *pVVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  undefined1 auVar27 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar28;
  ulong local_248;
  BVHNodeRecord<embree::NodeRefPtr<8>_> *local_240;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
  *local_238;
  range<unsigned_int> local_230;
  range<unsigned_int> children [8];
  undefined1 local_1e8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1d8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1c8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  
  this_00 = alloc.alloc;
  pTVar6 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)bounds,"depth limit reached",(allocator *)children);
    *puVar11 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar11 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar11 + 2),(string *)bounds);
    __cxa_throw(puVar11,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar19 = (this->super_Settings).maxLeafSize;
  if (current->_end - current->_begin <= uVar19) {
    CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
    return __return_storage_ptr__;
  }
  children[0] = *current;
  uVar12 = (this->super_Settings).branchingFactor;
  uVar22 = 1;
  do {
    uVar14 = 0;
    uVar20 = 0xffffffffffffffff;
    for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
      uVar17 = (ulong)(children[uVar13]._end - children[uVar13]._begin);
      uVar7 = uVar13;
      if (uVar17 <= uVar19 || uVar17 <= uVar14) {
        uVar17 = uVar14;
        uVar7 = uVar20;
      }
      uVar20 = uVar7;
      uVar14 = uVar17;
    }
    if (uVar20 == 0xffffffffffffffff) break;
    uVar16 = children[uVar20]._end + children[uVar20]._begin >> 1;
    rVar15._end = children[uVar20]._end;
    rVar15._begin = uVar16;
    rVar18._end = uVar16;
    rVar18._begin = children[uVar20]._begin;
    children[uVar20] = children[uVar22 - 1];
    children[uVar22 - 1] = rVar18;
    children[uVar22] = rVar15;
    uVar22 = uVar22 + 1;
  } while (uVar22 < uVar12);
  local_248 = 0x100;
  rVar15 = (range<unsigned_int>)(alloc.talloc0)->parent;
  if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)((long)rVar15 + 8))->_M_b)._M_p) {
    local_1e8[8] = true;
    local_1e8._0_8_ = rVar15;
    MutexSys::lock((MutexSys *)rVar15);
    if ((((atomic<embree::FastAllocator_*> *)((long)rVar15 + 8))->_M_b)._M_p != (__pointer_type)0x0)
    {
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar15 + 8))->_M_b)._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)rVar15 + 0xa8) + (long)*(void **)((long)rVar15 + 0x68);
      UNLOCK();
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar15 + 8))->_M_b)._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)rVar15 + 0x58) + (long)*(void **)((long)rVar15 + 0x98)) -
           ((long)*(void **)((long)rVar15 + 0x50) + (long)*(void **)((long)rVar15 + 0x90)));
      UNLOCK();
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar15 + 8))->_M_b)._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)rVar15 + 0xb0) + (long)*(void **)((long)rVar15 + 0x70);
      UNLOCK();
    }
    auVar25 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)rVar15 + 0x58) = ZEXT1632(auVar25);
    *(undefined1 (*) [32])((long)rVar15 + 0x48) = ZEXT1632(auVar25);
    auVar27 = ZEXT1632(auVar25);
    if (this_00 == (FastAllocator *)0x0) {
      *(undefined1 (*) [32])((long)rVar15 + 0x98) = auVar27;
      *(undefined1 (*) [32])((long)rVar15 + 0x88) = auVar27;
    }
    else {
      *(void **)((long)rVar15 + 0x60) = (void *)this_00->defaultBlockSize;
      *(undefined1 (*) [32])((long)rVar15 + 0x88) = auVar27;
      *(undefined1 (*) [32])((long)rVar15 + 0x98) = auVar27;
      *(void **)((long)rVar15 + 0xa0) = (void *)this_00->defaultBlockSize;
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)((long)rVar15 + 8))->_M_b)._M_p = this_00;
    UNLOCK();
    bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    bounds[0]._8_1_ = 1;
    local_230 = rVar15;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&local_230);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1e8);
  }
  uVar19 = local_248;
  pTVar6->bytesUsed = pTVar6->bytesUsed + local_248;
  sVar10 = pTVar6->cur;
  uVar12 = (ulong)(-(int)sVar10 & 0x1f);
  uVar20 = sVar10 + local_248 + uVar12;
  pTVar6->cur = uVar20;
  local_240 = __return_storage_ptr__;
  local_238 = this;
  if (pTVar6->end < uVar20) {
    pTVar6->cur = sVar10;
    uVar12 = pTVar6->allocBlockSize;
    if (local_248 * 4 < uVar12 || local_248 * 4 - uVar12 == 0) {
      bounds[0].ref.ptr = uVar12;
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)bounds);
      pTVar6->ptr = pcVar21;
      sVar10 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar10;
      pTVar6->end = bounds[0].ref.ptr;
      pTVar6->cur = uVar19;
      if (bounds[0].ref.ptr < uVar19) {
        pTVar6->cur = 0;
        bounds[0].ref.ptr = pTVar6->allocBlockSize;
        pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)bounds);
        pTVar6->ptr = pcVar21;
        sVar10 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar10;
        pTVar6->end = bounds[0].ref.ptr;
        pTVar6->cur = uVar19;
        if (bounds[0].ref.ptr < uVar19) {
          pTVar6->cur = 0;
          pcVar21 = (char *)0x0;
          goto LAB_00e286c5;
        }
      }
      pTVar6->bytesWasted = sVar10;
    }
    else {
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_248);
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar12;
    pcVar21 = pTVar6->ptr + (uVar20 - local_248);
  }
LAB_00e286c5:
  pcVar21[0xc0] = '\0';
  pcVar21[0xc1] = '\0';
  pcVar21[0xc2] = -0x80;
  pcVar21[0xc3] = '\x7f';
  pcVar21[0xc4] = '\0';
  pcVar21[0xc5] = '\0';
  pcVar21[0xc6] = -0x80;
  pcVar21[199] = '\x7f';
  pcVar21[200] = '\0';
  pcVar21[0xc9] = '\0';
  pcVar21[0xca] = -0x80;
  pcVar21[0xcb] = '\x7f';
  pcVar21[0xcc] = '\0';
  pcVar21[0xcd] = '\0';
  pcVar21[0xce] = -0x80;
  pcVar21[0xcf] = '\x7f';
  pcVar21[0xd0] = '\0';
  pcVar21[0xd1] = '\0';
  pcVar21[0xd2] = -0x80;
  pcVar21[0xd3] = '\x7f';
  pcVar21[0xd4] = '\0';
  pcVar21[0xd5] = '\0';
  pcVar21[0xd6] = -0x80;
  pcVar21[0xd7] = '\x7f';
  pcVar21[0xd8] = '\0';
  pcVar21[0xd9] = '\0';
  pcVar21[0xda] = -0x80;
  pcVar21[0xdb] = '\x7f';
  pcVar21[0xdc] = '\0';
  pcVar21[0xdd] = '\0';
  pcVar21[0xde] = -0x80;
  pcVar21[0xdf] = '\x7f';
  pcVar21[0x80] = '\0';
  pcVar21[0x81] = '\0';
  pcVar21[0x82] = -0x80;
  pcVar21[0x83] = '\x7f';
  pcVar21[0x84] = '\0';
  pcVar21[0x85] = '\0';
  pcVar21[0x86] = -0x80;
  pcVar21[0x87] = '\x7f';
  pcVar21[0x88] = '\0';
  pcVar21[0x89] = '\0';
  pcVar21[0x8a] = -0x80;
  pcVar21[0x8b] = '\x7f';
  pcVar21[0x8c] = '\0';
  pcVar21[0x8d] = '\0';
  pcVar21[0x8e] = -0x80;
  pcVar21[0x8f] = '\x7f';
  pcVar21[0x90] = '\0';
  pcVar21[0x91] = '\0';
  pcVar21[0x92] = -0x80;
  pcVar21[0x93] = '\x7f';
  pcVar21[0x94] = '\0';
  pcVar21[0x95] = '\0';
  pcVar21[0x96] = -0x80;
  pcVar21[0x97] = '\x7f';
  pcVar21[0x98] = '\0';
  pcVar21[0x99] = '\0';
  pcVar21[0x9a] = -0x80;
  pcVar21[0x9b] = '\x7f';
  pcVar21[0x9c] = '\0';
  pcVar21[0x9d] = '\0';
  pcVar21[0x9e] = -0x80;
  pcVar21[0x9f] = '\x7f';
  pcVar21[0x40] = '\0';
  pcVar21[0x41] = '\0';
  pcVar21[0x42] = -0x80;
  pcVar21[0x43] = '\x7f';
  pcVar21[0x44] = '\0';
  pcVar21[0x45] = '\0';
  pcVar21[0x46] = -0x80;
  pcVar21[0x47] = '\x7f';
  pcVar21[0x48] = '\0';
  pcVar21[0x49] = '\0';
  pcVar21[0x4a] = -0x80;
  pcVar21[0x4b] = '\x7f';
  pcVar21[0x4c] = '\0';
  pcVar21[0x4d] = '\0';
  pcVar21[0x4e] = -0x80;
  pcVar21[0x4f] = '\x7f';
  pcVar21[0x50] = '\0';
  pcVar21[0x51] = '\0';
  pcVar21[0x52] = -0x80;
  pcVar21[0x53] = '\x7f';
  pcVar21[0x54] = '\0';
  pcVar21[0x55] = '\0';
  pcVar21[0x56] = -0x80;
  pcVar21[0x57] = '\x7f';
  pcVar21[0x58] = '\0';
  pcVar21[0x59] = '\0';
  pcVar21[0x5a] = -0x80;
  pcVar21[0x5b] = '\x7f';
  pcVar21[0x5c] = '\0';
  pcVar21[0x5d] = '\0';
  pcVar21[0x5e] = -0x80;
  pcVar21[0x5f] = '\x7f';
  pcVar21[0xe0] = '\0';
  pcVar21[0xe1] = '\0';
  pcVar21[0xe2] = -0x80;
  pcVar21[0xe3] = -1;
  pcVar21[0xe4] = '\0';
  pcVar21[0xe5] = '\0';
  pcVar21[0xe6] = -0x80;
  pcVar21[0xe7] = -1;
  pcVar21[0xe8] = '\0';
  pcVar21[0xe9] = '\0';
  pcVar21[0xea] = -0x80;
  pcVar21[0xeb] = -1;
  pcVar21[0xec] = '\0';
  pcVar21[0xed] = '\0';
  pcVar21[0xee] = -0x80;
  pcVar21[0xef] = -1;
  pcVar21[0xf0] = '\0';
  pcVar21[0xf1] = '\0';
  pcVar21[0xf2] = -0x80;
  pcVar21[0xf3] = -1;
  pcVar21[0xf4] = '\0';
  pcVar21[0xf5] = '\0';
  pcVar21[0xf6] = -0x80;
  pcVar21[0xf7] = -1;
  pcVar21[0xf8] = '\0';
  pcVar21[0xf9] = '\0';
  pcVar21[0xfa] = -0x80;
  pcVar21[0xfb] = -1;
  pcVar21[0xfc] = '\0';
  pcVar21[0xfd] = '\0';
  pcVar21[0xfe] = -0x80;
  pcVar21[0xff] = -1;
  pcVar21[0xa0] = '\0';
  pcVar21[0xa1] = '\0';
  pcVar21[0xa2] = -0x80;
  pcVar21[0xa3] = -1;
  pcVar21[0xa4] = '\0';
  pcVar21[0xa5] = '\0';
  pcVar21[0xa6] = -0x80;
  pcVar21[0xa7] = -1;
  pcVar21[0xa8] = '\0';
  pcVar21[0xa9] = '\0';
  pcVar21[0xaa] = -0x80;
  pcVar21[0xab] = -1;
  pcVar21[0xac] = '\0';
  pcVar21[0xad] = '\0';
  pcVar21[0xae] = -0x80;
  pcVar21[0xaf] = -1;
  pcVar21[0xb0] = '\0';
  pcVar21[0xb1] = '\0';
  pcVar21[0xb2] = -0x80;
  pcVar21[0xb3] = -1;
  pcVar21[0xb4] = '\0';
  pcVar21[0xb5] = '\0';
  pcVar21[0xb6] = -0x80;
  pcVar21[0xb7] = -1;
  pcVar21[0xb8] = '\0';
  pcVar21[0xb9] = '\0';
  pcVar21[0xba] = -0x80;
  pcVar21[0xbb] = -1;
  pcVar21[0xbc] = '\0';
  pcVar21[0xbd] = '\0';
  pcVar21[0xbe] = -0x80;
  pcVar21[0xbf] = -1;
  pcVar21[0x60] = '\0';
  pcVar21[0x61] = '\0';
  pcVar21[0x62] = -0x80;
  pcVar21[99] = -1;
  pcVar21[100] = '\0';
  pcVar21[0x65] = '\0';
  pcVar21[0x66] = -0x80;
  pcVar21[0x67] = -1;
  pcVar21[0x68] = '\0';
  pcVar21[0x69] = '\0';
  pcVar21[0x6a] = -0x80;
  pcVar21[0x6b] = -1;
  pcVar21[0x6c] = '\0';
  pcVar21[0x6d] = '\0';
  pcVar21[0x6e] = -0x80;
  pcVar21[0x6f] = -1;
  pcVar21[0x70] = '\0';
  pcVar21[0x71] = '\0';
  pcVar21[0x72] = -0x80;
  pcVar21[0x73] = -1;
  pcVar21[0x74] = '\0';
  pcVar21[0x75] = '\0';
  pcVar21[0x76] = -0x80;
  pcVar21[0x77] = -1;
  pcVar21[0x78] = '\0';
  pcVar21[0x79] = '\0';
  pcVar21[0x7a] = -0x80;
  pcVar21[0x7b] = -1;
  pcVar21[0x7c] = '\0';
  pcVar21[0x7d] = '\0';
  pcVar21[0x7e] = -0x80;
  pcVar21[0x7f] = -1;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    pcVar3 = pcVar21 + lVar8 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
  current_00 = children;
  pVVar23 = &bounds[0].bounds.upper;
  uVar19 = uVar22;
  while (bVar24 = uVar19 != 0, uVar19 = uVar19 - 1, bVar24) {
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf((BVHNodeRecord<embree::NodeRefPtr<8>_> *)local_1e8,local_238,depth + 1,
                    current_00,alloc_00);
    *(uint *)&pVVar23[-2].field_0 = local_1e8._0_4_;
    *(undefined4 *)((long)&pVVar23[-2].field_0 + 4) = local_1e8._4_4_;
    *(undefined8 *)&(((BBox3fx *)(pVVar23 + -1))->lower).field_0 = local_1d8._0_8_;
    *(undefined8 *)((long)&(((BBox3fx *)(pVVar23 + -1))->lower).field_0 + 8) = local_1d8._8_8_;
    *(undefined8 *)&pVVar23->field_0 = local_1c8._0_8_;
    *(undefined8 *)((long)&pVVar23->field_0 + 8) = local_1c8._8_8_;
    current_00 = current_00 + 1;
    pVVar23 = pVVar23 + 3;
  }
  aVar26.m128[2] = -INFINITY;
  aVar26._0_8_ = 0xff800000ff800000;
  aVar26.m128[3] = -INFINITY;
  aVar28.m128[2] = INFINITY;
  aVar28._0_8_ = 0x7f8000007f800000;
  aVar28.m128[3] = INFINITY;
  paVar9 = &bounds[0].bounds.upper.field_0;
  for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
    paVar1 = paVar9 + -1;
    auVar25._0_4_ = *(float *)paVar1;
    auVar25._4_4_ = *(float *)((long)paVar1 + 4);
    auVar25._8_4_ = *(float *)((long)paVar1 + 8);
    auVar25._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar4.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar9->field_1;
    *(undefined8 *)(pcVar21 + uVar19 * 8) = *(undefined8 *)(paVar9 + -2);
    *(undefined4 *)(pcVar21 + uVar19 * 4 + 0x40) = auVar25._0_4_;
    uVar5 = vextractps_avx(auVar25,1);
    *(undefined4 *)(pcVar21 + uVar19 * 4 + 0x80) = uVar5;
    uVar5 = vextractps_avx(auVar25,2);
    *(undefined4 *)(pcVar21 + uVar19 * 4 + 0xc0) = uVar5;
    *(int *)(pcVar21 + uVar19 * 4 + 0x60) = VVar4.field_0._0_4_;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,1);
    *(undefined4 *)(pcVar21 + uVar19 * 4 + 0xa0) = uVar5;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,2);
    *(undefined4 *)(pcVar21 + uVar19 * 4 + 0xe0) = uVar5;
    aVar28.m128 = (__m128)vminps_avx(aVar28.m128,auVar25);
    aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,(undefined1  [16])VVar4.field_0);
    paVar9 = paVar9 + 3;
  }
  (local_240->ref).ptr = (size_t)pcVar21;
  (local_240->bounds).lower.field_0 = aVar28;
  (local_240->bounds).upper.field_0 = aVar26;
  return local_240;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }